

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  typed_value<bool,_char> *ptVar4;
  basic_command_line_parser<char> *this;
  size_type sVar5;
  any *paVar6;
  bool *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ostream *poVar9;
  string *psVar10;
  int iVar11;
  allocator<char> local_265;
  allocator<char> local_264;
  allocator<char> local_263;
  allocator<char> local_262;
  allocator<char> local_261;
  ArgumentsChecker argumentsChecker;
  DatFileUnpacker datFileUnpacker;
  string local_218;
  Arguments arguments;
  string local_180 [32];
  string local_160 [32];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_130 [144];
  options_description argumentsDescription;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vm,"Arguments",(allocator<char> *)&arguments);
  boost::program_options::options_description::options_description
            (&argumentsDescription,(string *)&vm,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&vm);
  arguments._0_8_ = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (&arguments.quietMode,"help");
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  ptVar3->m_required = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vm,"dat2",(allocator<char> *)&argumentsChecker);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&vm);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"format,f",(char *)ptVar3);
  ptVar4 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  datFileUnpacker._errorMessage._M_dataplus._M_p =
       datFileUnpacker._errorMessage._M_dataplus._M_p & 0xffffffffffffff00;
  ptVar4 = boost::program_options::typed_value<bool,_char>::default_value
                     (ptVar4,(bool *)&datFileUnpacker);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"quiet,q",(char *)ptVar4);
  ptVar4 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  local_218._M_dataplus._M_p._0_1_ = 0;
  ptVar4 = boost::program_options::typed_value<bool,_char>::default_value(ptVar4,(bool *)&local_218)
  ;
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"transform,t",(char *)ptVar4);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  ptVar3->m_required = true;
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"source,s",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  ptVar3->m_required = true;
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"destination,d",(char *)ptVar3);
  std::__cxx11::string::~string((string *)&vm);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&arguments,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&arguments,&argumentsDescription);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&argumentsChecker,this);
  boost::program_options::store((basic_parsed_options *)&argumentsChecker,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&argumentsChecker);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&arguments);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arguments,"help",(allocator<char> *)&argumentsChecker);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_130,(key_type *)&arguments);
  std::__cxx11::string::~string((string *)&arguments);
  if (sVar5 == 0) {
    boost::program_options::notify(&vm);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&argumentsChecker,"quiet",&local_261);
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar7 = boost::any_cast<bool_const&>(paVar6);
    arguments.quietMode = *pbVar7;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&datFileUnpacker,"transform",&local_262);
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar7 = boost::any_cast<bool_const&>(paVar6);
    arguments.transformNames = *pbVar7;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"source",&local_263);
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar8 = boost::any_cast<std::__cxx11::string_const&>(paVar6);
    std::__cxx11::string::string((string *)&arguments.source,(string *)pbVar8);
    std::__cxx11::string::string<std::allocator<char>>(local_160,"destination",&local_264);
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar8 = boost::any_cast<std::__cxx11::string_const&>(paVar6);
    std::__cxx11::string::string((string *)&arguments.destination,(string *)pbVar8);
    std::__cxx11::string::string<std::allocator<char>>(local_180,"format",&local_265);
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar8 = boost::any_cast<std::__cxx11::string_const&>(paVar6);
    bVar1 = std::operator==(pbVar8,"dat2");
    arguments.format = bVar1 + FALLOUT1;
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&datFileUnpacker);
    std::__cxx11::string::~string((string *)&argumentsChecker);
    argumentsChecker._errorMessage._M_dataplus._M_p =
         (pointer)&argumentsChecker._errorMessage.field_2;
    argumentsChecker._errorMessage._M_string_length = 0;
    argumentsChecker._errorMessage.field_2._M_local_buf[0] = '\0';
    bVar1 = DatUnpacker::ArgumentsChecker::check(&argumentsChecker,&arguments);
    if (bVar1) {
      datFileUnpacker._errorMessage._M_dataplus._M_p =
           (pointer)&datFileUnpacker._errorMessage.field_2;
      datFileUnpacker._errorMessage._M_string_length = 0;
      datFileUnpacker._errorMessage.field_2._M_local_buf[0] = '\0';
      bVar1 = DatUnpacker::DatFileUnpacker::unpack(&datFileUnpacker,&arguments);
      iVar11 = 0;
      if (!bVar1) {
        iVar11 = 1;
        if (arguments.quietMode == false) {
          DatUnpacker::DatFileUnpacker::getErrorMessage_abi_cxx11_(&local_218,&datFileUnpacker);
          poVar9 = std::operator<<((ostream *)&std::cerr,(string *)&local_218);
          poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__cxx11::string::~string((string *)&local_218);
        }
      }
      std::__cxx11::string::~string((string *)&datFileUnpacker);
    }
    else {
      iVar11 = 1;
      if (arguments.quietMode == false) {
        psVar10 = DatUnpacker::ArgumentsChecker::getErrorMessage_abi_cxx11_(&argumentsChecker);
        poVar9 = std::operator<<((ostream *)&std::cerr,(string *)psVar10);
        poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
    }
    std::__cxx11::string::~string((string *)&argumentsChecker);
    DatUnpacker::Arguments::~Arguments(&arguments);
  }
  else {
    usage(&argumentsDescription);
    iVar11 = 1;
  }
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::options_description::~options_description(&argumentsDescription);
  return iVar11;
}

Assistant:

int main(int argc, char** argv)
{
    namespace po = boost::program_options;

    po::options_description argumentsDescription("Arguments");
    argumentsDescription.add_options()
        ("help", "Produce help message")
        ("format,f", po::value<std::string>()->required()->default_value("dat2"), "Fallout DAT file format version. 'dat1' or 'dat2'. 'dat2' is default")
        ("quiet,q", po::bool_switch()->default_value(false), "Quite mode. Do not display anything")
        ("transform,t", po::bool_switch()->default_value(false), "Transform file names to lowercase")
        ("source,s", po::value<std::string>()->required(), "Path to the DAT file")
        ("destination,d", po::value<std::string>()->required(), "Where to extract files");

    po::variables_map vm;
    po::store(po::command_line_parser(argc, argv).options(argumentsDescription).run(), vm);

    if (vm.count("help")) {
      usage(argumentsDescription);
      return 1;
    }

    try {
      po::notify(vm);
    } catch (std::exception& e) {
      std::cout << "Error: " << e.what() << std::endl;
      usage(argumentsDescription);
      return 1;
    }

    Arguments arguments = {
        vm["quiet"].as<bool>(),
        vm["transform"].as<bool>(),
        vm["source"].as<std::string>(),
        vm["destination"].as<std::string>(),
        vm["format"].as<std::string>() == "dat2" ? Format::FALLOUT2 : Format::FALLOUT1
    };

    ArgumentsChecker argumentsChecker;
    if (!argumentsChecker.check(arguments)) {
        if (!arguments.quietMode) {
            std::cerr << argumentsChecker.getErrorMessage() << std::endl << std::endl;
        }
        return 1;
    }

    DatFileUnpacker datFileUnpacker;
    if (!datFileUnpacker.unpack(arguments)) {
        if (!arguments.quietMode) {
            std::cerr << datFileUnpacker.getErrorMessage() << std::endl << std::endl;
        }
        return 1;
    }

    return 0;
}